

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O3

void pnga_fill_patch(Integer g_a,Integer *lo,Integer *hi,void *val)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  int iVar5;
  logical lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  long ndim_00;
  Integer IVar17;
  long lVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  char *data_ptr;
  Integer loA [7];
  Integer type;
  Integer ndim;
  Integer hiA [7];
  Integer ld [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  char *local_558;
  undefined8 uStack_550;
  long local_548 [8];
  Integer *local_508;
  Integer *local_500;
  Integer local_4f8;
  long local_4f0 [9];
  undefined1 local_4a8 [16];
  undefined1 local_498 [48];
  long local_468 [8];
  long alStack_428 [8];
  long local_3e8 [7];
  long alStack_3b0 [9];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_508 = lo;
  local_500 = hi;
  pnga_nodeid();
  bVar19 = _ga_sync_begin != 0;
  uStack_550._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar19) {
    pnga_sync();
  }
  pnga_inquire(g_a,&local_4f8,local_4f0,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar5 = pnga_local_iterator_next(&local_330,local_548,local_4f0 + 1,&local_558,local_3e8);
  ndim_00 = local_4f0[0];
  do {
    if (iVar5 == 0) {
      if (uStack_550._4_4_ != 0) {
        pnga_sync();
      }
      return;
    }
    local_4f0[0] = ndim_00;
    if (ndim_00 < 1) {
      lVar6 = pnga_patch_intersect(local_508,local_500,local_548,local_4f0 + 1,ndim_00);
      IVar17 = local_4f8;
      if (lVar6 != 0) {
LAB_00156714:
        pcVar4 = local_558;
        lVar7 = 1;
        if (1 < ndim_00) {
          lVar8 = 1;
          do {
            lVar7 = lVar7 * ((local_4f0[lVar8 + 1] - local_548[lVar8]) + 1);
            lVar8 = lVar8 + 1;
          } while (ndim_00 != lVar8);
        }
        local_4a8 = (undefined1  [16])0x0;
        alStack_428[1] = 1;
        local_468[0] = local_3e8[0];
        lVar8 = local_3e8[0] * local_3e8[1];
        local_468[1] = lVar8;
        if (2 < ndim_00) {
          memset(local_498,0,ndim_00 * 8 - 0x10);
          lVar9 = 2;
          lVar11 = 1;
          do {
            lVar11 = lVar11 * ((local_4f0[lVar9] - (&uStack_550)[lVar9]) + 1);
            lVar8 = lVar8 * local_3e8[lVar9];
            alStack_428[lVar9] = lVar11;
            local_468[lVar9] = lVar8;
            lVar9 = lVar9 + 1;
          } while (ndim_00 != lVar9);
        }
        auVar3 = _DAT_001b1020;
        lVar8 = (long)DAT_001b1030;
        lVar9 = DAT_001b1030._8_8_;
        switch(IVar17) {
        case 0x3e9:
          if (0 < lVar7) {
            lVar8 = 0;
            do {
              if (ndim_00 < 2) {
                lVar9 = 0;
              }
              else {
                lVar11 = 0;
                lVar9 = 0;
                do {
                  lVar9 = lVar9 + local_468[lVar11] * *(long *)(local_4a8 + lVar11 * 8 + 8);
                  lVar16 = *(long *)(local_4a8 + lVar11 * 8 + 8) +
                           (ulong)((lVar8 + 1) % alStack_428[lVar11 + 1] == 0);
                  lVar14 = 0;
                  if (lVar16 <= local_4f0[lVar11 + 2] - local_548[lVar11 + 1]) {
                    lVar14 = lVar16;
                  }
                  *(long *)(local_4a8 + lVar11 * 8 + 8) = lVar14;
                  lVar11 = lVar11 + 1;
                } while (ndim_00 + -1 != lVar11);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar11 = 0;
                do {
                  *(undefined4 *)(pcVar4 + lVar11 * 4 + lVar9 * 4) = *val;
                  lVar11 = lVar11 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar11);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar7);
          }
          break;
        case 0x3ea:
          if (0 < lVar7) {
            lVar8 = 0;
            do {
              if (ndim_00 < 2) {
                lVar9 = 0;
              }
              else {
                lVar11 = 0;
                lVar9 = 0;
                do {
                  lVar9 = lVar9 + local_468[lVar11] * *(long *)(local_4a8 + lVar11 * 8 + 8);
                  lVar16 = *(long *)(local_4a8 + lVar11 * 8 + 8) +
                           (ulong)((lVar8 + 1) % alStack_428[lVar11 + 1] == 0);
                  lVar14 = 0;
                  if (lVar16 <= local_4f0[lVar11 + 2] - local_548[lVar11 + 1]) {
                    lVar14 = lVar16;
                  }
                  *(long *)(local_4a8 + lVar11 * 8 + 8) = lVar14;
                  lVar11 = lVar11 + 1;
                } while (ndim_00 + -1 != lVar11);
              }
              if (local_548[0] <= local_4f0[1]) {
                uVar2 = *val;
                lVar11 = -1;
                do {
                  *(undefined8 *)(pcVar4 + lVar11 * 8 + lVar9 * 8 + 8) = uVar2;
                  lVar11 = lVar11 + 1;
                } while (lVar11 < local_4f0[1] - local_548[0]);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar7);
          }
          break;
        case 0x3eb:
          if (0 < lVar7) {
            lVar8 = local_4f0[1] - local_548[0];
            auVar20._8_4_ = (int)lVar8;
            auVar20._0_8_ = lVar8;
            auVar20._12_4_ = (int)((ulong)lVar8 >> 0x20);
            auVar20 = auVar20 ^ _DAT_001b1020;
            lVar9 = 0;
            do {
              if (ndim_00 < 2) {
                lVar11 = 0;
              }
              else {
                lVar14 = 0;
                lVar11 = 0;
                do {
                  lVar11 = lVar11 + local_468[lVar14] * *(long *)(local_4a8 + lVar14 * 8 + 8);
                  lVar18 = *(long *)(local_4a8 + lVar14 * 8 + 8) +
                           (ulong)((lVar9 + 1) % alStack_428[lVar14 + 1] == 0);
                  lVar16 = 0;
                  if (lVar18 <= local_4f0[lVar14 + 2] - local_548[lVar14 + 1]) {
                    lVar16 = lVar18;
                  }
                  *(long *)(local_4a8 + lVar14 * 8 + 8) = lVar16;
                  lVar14 = lVar14 + 1;
                } while (ndim_00 + -1 != lVar14);
              }
              if (local_548[0] <= local_4f0[1]) {
                uVar1 = *val;
                lVar11 = lVar11 * 4;
                uVar12 = 0;
                auVar22 = _DAT_001b1010;
                auVar24 = _DAT_001b20e0;
                do {
                  auVar25 = auVar22 ^ auVar3;
                  iVar5 = auVar20._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar5 && auVar20._0_4_ < auVar25._0_4_ ||
                              iVar5 < auVar25._4_4_) & 1)) {
                    *(undefined4 *)(pcVar4 + uVar12 * 4 + lVar11) = uVar1;
                  }
                  if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
                      auVar25._12_4_ <= auVar20._12_4_) {
                    *(undefined4 *)(pcVar4 + uVar12 * 4 + lVar11 + 4) = uVar1;
                  }
                  iVar27 = SUB164(auVar24 ^ auVar3,4);
                  if (iVar27 <= iVar5 &&
                      (iVar27 != iVar5 || SUB164(auVar24 ^ auVar3,0) <= auVar20._0_4_)) {
                    *(undefined4 *)(pcVar4 + uVar12 * 4 + lVar11 + 8) = uVar1;
                    *(undefined4 *)(pcVar4 + uVar12 * 4 + lVar11 + 0xc) = uVar1;
                  }
                  uVar12 = uVar12 + 4;
                  lVar14 = auVar22._8_8_;
                  auVar22._0_8_ = auVar22._0_8_ + 4;
                  auVar22._8_8_ = lVar14 + 4;
                  lVar14 = auVar24._8_8_;
                  auVar24._0_8_ = auVar24._0_8_ + 4;
                  auVar24._8_8_ = lVar14 + 4;
                } while ((lVar8 + 4U & 0xfffffffffffffffc) != uVar12);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != lVar7);
          }
          break;
        case 0x3ec:
          if (0 < lVar7) {
            lVar11 = local_4f0[1] - local_548[0];
            auVar21._8_4_ = (int)lVar11;
            auVar21._0_8_ = lVar11;
            auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
            lVar14 = 0;
            do {
              if (ndim_00 < 2) {
                lVar16 = 0;
              }
              else {
                lVar18 = 0;
                lVar16 = 0;
                do {
                  lVar16 = lVar16 + local_468[lVar18] * *(long *)(local_4a8 + lVar18 * 8 + 8);
                  lVar13 = *(long *)(local_4a8 + lVar18 * 8 + 8) +
                           (ulong)((lVar14 + 1) % alStack_428[lVar18 + 1] == 0);
                  lVar10 = 0;
                  if (lVar13 <= local_4f0[lVar18 + 2] - local_548[lVar18 + 1]) {
                    lVar10 = lVar13;
                  }
                  *(long *)(local_4a8 + lVar18 * 8 + 8) = lVar10;
                  lVar18 = lVar18 + 1;
                } while (ndim_00 + -1 != lVar18);
              }
              if (local_548[0] <= local_4f0[1]) {
                uVar2 = *val;
                uVar12 = 0;
                auVar23 = _DAT_001b1010;
                do {
                  auVar25 = auVar21 ^ auVar3;
                  auVar26 = auVar23 ^ auVar3;
                  if ((bool)(~(auVar26._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar26._0_4_ ||
                              auVar25._4_4_ < auVar26._4_4_) & 1)) {
                    *(undefined8 *)(pcVar4 + uVar12 * 8 + lVar16 * 8) = uVar2;
                  }
                  if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
                      auVar26._12_4_ <= auVar25._12_4_) {
                    *(undefined8 *)(pcVar4 + uVar12 * 8 + lVar16 * 8 + 8) = uVar2;
                  }
                  uVar12 = uVar12 + 2;
                  lVar18 = auVar23._8_8_;
                  auVar23._0_8_ = auVar23._0_8_ + lVar8;
                  auVar23._8_8_ = lVar18 + lVar9;
                } while ((lVar11 + 2U & 0xfffffffffffffffe) != uVar12);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != lVar7);
          }
          break;
        default:
          pnga_error(" wrong data type ",IVar17);
          break;
        case 0x3ee:
          if (0 < lVar7) {
            lVar8 = 0;
            do {
              if (ndim_00 < 2) {
                lVar9 = 0;
              }
              else {
                lVar11 = 0;
                lVar9 = 0;
                do {
                  lVar9 = lVar9 + local_468[lVar11] * *(long *)(local_4a8 + lVar11 * 8 + 8);
                  lVar16 = *(long *)(local_4a8 + lVar11 * 8 + 8) +
                           (ulong)((lVar8 + 1) % alStack_428[lVar11 + 1] == 0);
                  lVar14 = 0;
                  if (lVar16 <= local_4f0[lVar11 + 2] - local_548[lVar11 + 1]) {
                    lVar14 = lVar16;
                  }
                  *(long *)(local_4a8 + lVar11 * 8 + 8) = lVar14;
                  lVar11 = lVar11 + 1;
                } while (ndim_00 + -1 != lVar11);
              }
              if (local_548[0] <= local_4f0[1]) {
                lVar11 = 0;
                do {
                  *(undefined8 *)(pcVar4 + lVar11 * 8 + lVar9 * 8) = *val;
                  lVar11 = lVar11 + 1;
                } while ((local_4f0[1] - local_548[0]) + 1 != lVar11);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar7);
          }
          break;
        case 0x3ef:
          if (0 < lVar7) {
            lVar8 = 0;
            do {
              if (ndim_00 < 2) {
                lVar9 = 0;
              }
              else {
                lVar11 = 0;
                lVar9 = 0;
                do {
                  lVar9 = lVar9 + local_468[lVar11] * *(long *)(local_4a8 + lVar11 * 8 + 8);
                  lVar16 = *(long *)(local_4a8 + lVar11 * 8 + 8) +
                           (ulong)((lVar8 + 1) % alStack_428[lVar11 + 1] == 0);
                  lVar14 = 0;
                  if (lVar16 <= local_4f0[lVar11 + 2] - local_548[lVar11 + 1]) {
                    lVar14 = lVar16;
                  }
                  *(long *)(local_4a8 + lVar11 * 8 + 8) = lVar14;
                  lVar11 = lVar11 + 1;
                } while (ndim_00 + -1 != lVar11);
              }
              if (local_548[0] <= local_4f0[1]) {
                pcVar15 = pcVar4 + lVar9 * 0x10;
                lVar9 = (local_4f0[1] - local_548[0]) + 1;
                do {
                  uVar2 = *(undefined8 *)((long)val + 8);
                  *(undefined8 *)pcVar15 = *val;
                  *(undefined8 *)(pcVar15 + 8) = uVar2;
                  pcVar15 = pcVar15 + 0x10;
                  lVar9 = lVar9 + -1;
                } while (lVar9 != 0);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar7);
          }
          break;
        case 0x3f8:
          if (0 < lVar7) {
            lVar11 = local_4f0[1] - local_548[0];
            auVar25._8_4_ = (int)lVar11;
            auVar25._0_8_ = lVar11;
            auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
            lVar14 = 0;
            do {
              if (ndim_00 < 2) {
                lVar16 = 0;
              }
              else {
                lVar18 = 0;
                lVar16 = 0;
                do {
                  lVar16 = lVar16 + local_468[lVar18] * *(long *)(local_4a8 + lVar18 * 8 + 8);
                  lVar13 = *(long *)(local_4a8 + lVar18 * 8 + 8) +
                           (ulong)((lVar14 + 1) % alStack_428[lVar18 + 1] == 0);
                  lVar10 = 0;
                  if (lVar13 <= local_4f0[lVar18 + 2] - local_548[lVar18 + 1]) {
                    lVar10 = lVar13;
                  }
                  *(long *)(local_4a8 + lVar18 * 8 + 8) = lVar10;
                  lVar18 = lVar18 + 1;
                } while (ndim_00 + -1 != lVar18);
              }
              if (local_548[0] <= local_4f0[1]) {
                uVar2 = *val;
                uVar12 = 0;
                auVar26 = _DAT_001b1010;
                do {
                  auVar21 = auVar25 ^ auVar3;
                  auVar23 = auVar26 ^ auVar3;
                  if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                              auVar21._4_4_ < auVar23._4_4_) & 1)) {
                    *(undefined8 *)(pcVar4 + uVar12 * 8 + lVar16 * 8) = uVar2;
                  }
                  if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
                      auVar23._12_4_ <= auVar21._12_4_) {
                    *(undefined8 *)(pcVar4 + uVar12 * 8 + lVar16 * 8 + 8) = uVar2;
                  }
                  uVar12 = uVar12 + 2;
                  lVar18 = auVar26._8_8_;
                  auVar26._0_8_ = auVar26._0_8_ + lVar8;
                  auVar26._8_8_ = lVar18 + lVar9;
                } while ((lVar11 + 2U & 0xfffffffffffffffe) != uVar12);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != lVar7);
          }
        }
      }
    }
    else {
      memcpy(alStack_3b0 + 1,local_548,ndim_00 * 8);
      lVar6 = pnga_patch_intersect(local_508,local_500,local_548,local_4f0 + 1,ndim_00);
      if (lVar6 != 0) {
        lVar7 = 0;
LAB_001566c0:
        IVar17 = local_4f8;
        if (local_548[lVar7] <= alStack_3b0[lVar7 + 1]) break;
        if (ndim_00 == 1) {
          lVar7 = 1;
          lVar8 = 0;
        }
        else {
          lVar7 = 1;
          lVar9 = 0;
          lVar8 = 0;
          do {
            lVar8 = lVar8 + (local_548[lVar9] - alStack_3b0[lVar9 + 1]) * lVar7;
            lVar7 = lVar7 * local_3e8[lVar9];
            lVar9 = lVar9 + 1;
          } while (ndim_00 + -1 != lVar9);
        }
        if (0xf < local_4f8 - 0x3e9U) {
switchD_0015693c_caseD_3ed:
          pnga_error(" wrong data type ",local_4f8);
          ndim_00 = local_4f0[0];
          IVar17 = local_4f8;
          goto LAB_00156714;
        }
        lVar8 = ((&uStack_550)[ndim_00] - alStack_3b0[ndim_00]) * lVar7 + lVar8;
        switch(local_4f8) {
        case 0x3e9:
          local_558 = local_558 + lVar8 * 4;
          IVar17 = 0x3e9;
          break;
        case 0x3ea:
          local_558 = local_558 + lVar8 * 8;
          IVar17 = 0x3ea;
          break;
        case 0x3eb:
          local_558 = local_558 + lVar8 * 4;
          IVar17 = 0x3eb;
          break;
        case 0x3ec:
          local_558 = local_558 + lVar8 * 8;
          IVar17 = 0x3ec;
          break;
        default:
          goto switchD_0015693c_caseD_3ed;
        case 0x3ee:
          lVar8 = lVar8 * 8;
          goto LAB_0015700e;
        case 0x3ef:
          lVar8 = lVar8 * 0x10;
LAB_0015700e:
          local_558 = local_558 + lVar8;
          break;
        case 0x3f8:
          local_558 = local_558 + lVar8 * 8;
          IVar17 = 0x3f8;
        }
        goto LAB_00156714;
      }
    }
    iVar5 = pnga_local_iterator_next(&local_330,local_548,local_4f0 + 1,&local_558,local_3e8);
    ndim_00 = local_4f0[0];
  } while( true );
  lVar7 = lVar7 + 1;
  if (ndim_00 == lVar7) goto LAB_00156714;
  goto LAB_001566c0;
}

Assistant:

void pnga_fill_patch(Integer g_a, Integer *lo, Integer *hi, void* val)
{
  Integer i;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer num_blocks, nproc;
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync(); 


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;     
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;                          
          case C_LONGLONG:
            data_ptr = (void*)((long long*)data_ptr + offset);
            break;                          
          default: pnga_error(" wrong data type ",type);
        }
      }

      /* set all values in patch to *val */
      snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);
    }
  }
#else
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */ 
    pnga_distribution(g_a, me, loA, hiA);

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* set all values in patch to *val */
      snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of patch */ 
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;     
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;                          
              case C_LONGLONG:
                data_ptr = (void*)((long long*)data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;     
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;                          
              case C_LONGLONG:
                data_ptr = (void*)((long long*)data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}